

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

bool __thiscall
ON_ArchivableDictionaryPrivate::TrySetValue<ON_wString>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_wString *value)

{
  _Base_ptr p_Var1;
  int iVar2;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  _Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar4;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_30;
  
  ON_wString::ON_wString(&local_30.first,key);
  local_30.second._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
  ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<DictionaryEntry,_std::default_delete<DictionaryEntry>,_true,_true>)
       (__uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>)0x0;
  pVar4 = std::
          _Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
          ::
          _M_insert_unique<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>
                    ((_Rb_tree<ON_wString,std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>,std::_Select1st<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                      *)&this->m_map,&local_30);
  _Var3 = pVar4.first._M_node;
  if ((_Head_base<0UL,_DictionaryEntry_*,_false>)
      local_30.second._M_t.
      super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
      super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
      super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl !=
      (_Head_base<0UL,_DictionaryEntry_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_30.second._M_t.
        super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
        super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
        super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl)[1])();
  }
  local_30.second._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
  ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
  super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl =
       (__uniq_ptr_data<DictionaryEntry,_std::default_delete<DictionaryEntry>,_true,_true>)
       (__uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>)0x0;
  ON_wString::~ON_wString(&local_30.first);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar2 = (**(code **)(*(long *)_Var3._M_node[1]._M_parent + 0x10))();
    if (iVar2 != 0xc) {
      return false;
    }
    ON_wString::operator=((ON_wString *)&(_Var3._M_node[1]._M_parent)->_M_parent,value);
  }
  else {
    make_entry<ON_wString>(&local_30.first);
    p_Var1 = _Var3._M_node[1]._M_parent;
    _Var3._M_node[1]._M_parent = (_Base_ptr)local_30.first.m_s;
    if (p_Var1 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1 + 8))();
    }
  }
  return true;
}

Assistant:

bool TrySetValue(const wchar_t* key, const V& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (r.second)
    {
      entry_ptr = make_entry(value);
      return true;
    }
    else if (entry_ptr->EntryType() == Entry<V>::Type)
    {
      static_cast<Entry<V>*>(entry_ptr.get())->Value() = value;
      return true;
    }

    return false;
  }